

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  float fVar1;
  size_t sVar2;
  int *piVar3;
  void *pvVar4;
  long *plVar5;
  iterator __position;
  Allocator *pAVar6;
  int iVar7;
  Layer *pLVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  float top_rescale;
  Option opt_q;
  ParamDict pd;
  Mat local_a28;
  Option *local_9e8;
  void *local_9e0;
  int *local_9d8;
  size_t local_9d0;
  int local_9c8;
  Allocator *local_9c0;
  undefined4 local_9b8;
  int local_9b4;
  undefined8 local_9b0;
  long local_9a8;
  vector<float,std::allocator<float>> *local_9a0;
  ModelBinFromMatArray local_998;
  size_t local_988;
  int local_980;
  Allocator *local_978;
  undefined4 local_970;
  int local_96c;
  undefined8 local_968;
  long local_960;
  undefined4 local_958;
  int iStack_954;
  Allocator *pAStack_950;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined8 local_938;
  ParamDict local_930;
  
  sVar2 = (this->weight_data).elemsize;
  bVar13 = opt->use_int8_inference;
  local_9e8 = opt;
  if (sVar2 == 1) {
    if ((bVar13 & 1U) == 0) {
      create_pipeline();
      return -1;
    }
    this->use_int8_inference = (bool)(bVar13 & 1);
  }
  else {
    if ((sVar2 == 4 & bVar13) == 0) {
      this->use_int8_inference = false;
      return 0;
    }
    bVar13 = this->int8_scale_term != 0;
    this->use_int8_inference = bVar13;
    if (!bVar13) {
      return 0;
    }
    local_a28.cstep = (size_t)this->weight_data_size;
    local_a28.data = (void *)0x0;
    local_a28.refcount = (int *)0x0;
    local_a28.elemsize = 1;
    local_a28.elempack = 1;
    local_a28.allocator = (Allocator *)0x0;
    local_a28.w = this->weight_data_size;
    local_a28.dims = 1;
    local_a28.h = 1;
    local_a28.c = 1;
    if (local_a28.cstep == 0) {
      return -100;
    }
    uVar12 = local_a28.cstep + 3 & 0xfffffffffffffffc;
    local_930.params[0]._0_8_ = (void *)0x0;
    iVar7 = posix_memalign((void **)&local_930,0x10,uVar12 + 4);
    local_a28.data = (void *)0x0;
    if (iVar7 == 0) {
      local_a28.data = (void *)local_930.params[0]._0_8_;
    }
    local_a28.refcount = (int *)((long)local_a28.data + uVar12);
    *(undefined4 *)((long)local_a28.data + uVar12) = 1;
    if ((long)local_a28.c * local_a28.cstep == 0) {
      LOCK();
      *local_a28.refcount = *local_a28.refcount + -1;
      UNLOCK();
      if (*local_a28.refcount != 0) {
        return -100;
      }
      if (local_a28.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_a28.allocator + 0x18))();
        return -100;
      }
      if (local_a28.data == (void *)0x0) {
        return -100;
      }
      free(local_a28.data);
      return -100;
    }
    iVar7 = this->weight_data_size / this->num_output;
    if (0 < this->num_output) {
      lVar11 = (long)iVar7;
      lVar9 = 0;
      do {
        pLVar8 = create_layer(0x39);
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,
                       *(float *)((long)(this->weight_data_int8_scales).data + lVar9 * 4));
        (*pLVar8->_vptr_Layer[2])(pLVar8,&local_930);
        (*pLVar8->_vptr_Layer[4])(pLVar8,local_9e8);
        local_958 = *(undefined4 *)local_9e8;
        iStack_954 = local_9e8->num_threads;
        local_948 = *(undefined4 *)&local_9e8->workspace_allocator;
        uStack_944 = *(undefined4 *)((long)&local_9e8->workspace_allocator + 4);
        uStack_940._0_1_ = local_9e8->use_winograd_convolution;
        uStack_940._1_1_ = local_9e8->use_sgemm_convolution;
        uStack_940._2_1_ = local_9e8->use_int8_inference;
        uStack_940._3_1_ = local_9e8->use_vulkan_compute;
        uStack_93c._0_1_ = local_9e8->use_fp16_packed;
        uStack_93c._1_1_ = local_9e8->use_fp16_storage;
        uStack_93c._2_1_ = local_9e8->use_fp16_arithmetic;
        uStack_93c._3_1_ = local_9e8->use_int8_storage;
        local_938._0_1_ = local_9e8->use_int8_arithmetic;
        local_938._1_1_ = local_9e8->use_packing_layout;
        local_938._2_6_ = *(undefined6 *)&local_9e8->field_0x22;
        pAStack_950 = local_a28.allocator;
        local_988 = (this->weight_data).elemsize;
        local_998.super_ModelBin._vptr_ModelBin =
             (_func_int **)(local_988 * lVar9 * lVar11 + (long)(this->weight_data).data);
        local_980 = (this->weight_data).elempack;
        local_978 = (this->weight_data).allocator;
        local_998.weights = (Mat *)0x0;
        local_970 = 1;
        local_968 = 0x100000001;
        local_9e0 = (void *)(lVar9 * lVar11 * local_a28.elemsize + (long)local_a28.data);
        local_9d8 = (int *)0x0;
        local_9d0 = local_a28.elemsize;
        local_9c8 = local_a28.elempack;
        local_9c0 = local_a28.allocator;
        local_9b8 = 1;
        local_9b0 = 0x100000001;
        local_9b4 = iVar7;
        local_9a8 = lVar11;
        local_96c = iVar7;
        local_960 = lVar11;
        (*pLVar8->_vptr_Layer[7])(pLVar8,&local_998,&local_9e0,&local_958);
        (*pLVar8->_vptr_Layer[1])(pLVar8);
        if (local_9d8 != (int *)0x0) {
          LOCK();
          *local_9d8 = *local_9d8 + -1;
          UNLOCK();
          if (*local_9d8 == 0) {
            if (local_9c0 == (Allocator *)0x0) {
              if (local_9e0 != (void *)0x0) {
                free(local_9e0);
              }
            }
            else {
              (**(code **)(*(long *)local_9c0 + 0x18))();
            }
          }
        }
        if (local_998.weights != (Mat *)0x0) {
          LOCK();
          *(int *)&(local_998.weights)->data = *(int *)&(local_998.weights)->data + -1;
          UNLOCK();
          if (*(int *)&(local_998.weights)->data == 0) {
            if (local_978 == (Allocator *)0x0) {
              if (local_998.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                free(local_998.super_ModelBin._vptr_ModelBin);
              }
            }
            else {
              (**(code **)(*(long *)local_978 + 0x18))();
            }
          }
        }
        lVar10 = 0x8c0;
        do {
          piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar10);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_930.params[0].type + lVar10);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar10);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar10 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar10 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar10) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar10) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar10) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar10) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar10) = 0;
          lVar10 = lVar10 + -0x48;
        } while (lVar10 != -0x40);
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->num_output);
    }
    if (&this->weight_data != &local_a28) {
      if (local_a28.refcount != (int *)0x0) {
        LOCK();
        *local_a28.refcount = *local_a28.refcount + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->weight_data).data;
          pAVar6 = (this->weight_data).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar6 + 0x18))();
          }
        }
      }
      (this->weight_data).data = local_a28.data;
      (this->weight_data).refcount = local_a28.refcount;
      (this->weight_data).elemsize = local_a28.elemsize;
      (this->weight_data).elempack = local_a28.elempack;
      (this->weight_data).allocator = local_a28.allocator;
      (this->weight_data).dims = local_a28.dims;
      (this->weight_data).w = local_a28.w;
      (this->weight_data).h = local_a28.h;
      (this->weight_data).c = local_a28.c;
      (this->weight_data).cstep = local_a28.cstep;
    }
    if (local_a28.refcount != (int *)0x0) {
      LOCK();
      *local_a28.refcount = *local_a28.refcount + -1;
      UNLOCK();
      if (*local_a28.refcount == 0) {
        if (local_a28.allocator == (Allocator *)0x0) {
          if (local_a28.data != (void *)0x0) {
            free(local_a28.data);
          }
        }
        else {
          (**(code **)(*(long *)local_a28.allocator + 0x18))();
        }
      }
    }
    if ((this->use_int8_inference & 1U) == 0) {
      return 0;
    }
  }
  pLVar8 = create_layer(0x39);
  this->quantize = pLVar8;
  ParamDict::ParamDict(&local_930);
  ParamDict::set(&local_930,0,this->bottom_blob_int8_scale);
  (*this->quantize->_vptr_Layer[2])(this->quantize,&local_930);
  (*this->quantize->_vptr_Layer[4])(this->quantize,local_9e8);
  lVar11 = 0x8c0;
  do {
    piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar11);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = *(void **)((long)&local_930.params[0].type + lVar11);
        plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar11);
        if (plVar5 == (long *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (**(code **)(*plVar5 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar11 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar11 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].type + lVar11) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar11) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar11) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.dims + lVar11) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.h + lVar11) = 0;
    lVar11 = lVar11 + -0x48;
  } while (lVar11 != -0x40);
  this_00 = &this->dequantize_ops;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(this_00,(long)this->num_output)
  ;
  if (0 < this->num_output) {
    local_9a0 = (vector<float,std::allocator<float>> *)&this->dequantize_scales;
    lVar11 = 0;
    do {
      pLVar8 = create_layer(0x3a);
      (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar11] = pLVar8;
      fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar11 * 4);
      local_9e0 = (void *)CONCAT44((int)((ulong)local_9e0 >> 0x20),
                                   ~-(uint)(fVar1 == 0.0) &
                                   (uint)(1.0 / (this->bottom_blob_int8_scale * fVar1)));
      ParamDict::ParamDict(&local_930);
      ParamDict::set(&local_930,0,local_9e0._0_4_);
      ParamDict::set(&local_930,1,this->bias_term);
      ParamDict::set(&local_930,2,1);
      pLVar8 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      (*pLVar8->_vptr_Layer[2])(pLVar8,&local_930);
      pLVar8 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      (*pLVar8->_vptr_Layer[4])(pLVar8,local_9e8);
      local_a28.allocator = (this->bias_data).allocator;
      local_a28.elempack = (this->bias_data).elempack;
      local_a28.elemsize = (this->bias_data).elemsize;
      local_a28.data = (void *)(local_a28.elemsize * lVar11 + (long)(this->bias_data).data);
      local_a28.refcount = (int *)0x0;
      local_a28.dims = 1;
      local_a28.w = 1;
      local_a28.h = 1;
      local_a28.c = 1;
      local_a28.cstep = 1;
      pLVar8 = (this->dequantize_ops).
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      ModelBinFromMatArray::ModelBinFromMatArray(&local_998,&local_a28);
      (*pLVar8->_vptr_Layer[3])(pLVar8,&local_998);
      ModelBin::~ModelBin(&local_998.super_ModelBin);
      __position._M_current =
           (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  (local_9a0,__position,(float *)&local_9e0);
      }
      else {
        *__position._M_current = local_9e0._0_4_;
        (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (local_a28.refcount != (int *)0x0) {
        LOCK();
        *local_a28.refcount = *local_a28.refcount + -1;
        UNLOCK();
        if (*local_a28.refcount == 0) {
          if (local_a28.allocator == (Allocator *)0x0) {
            if (local_a28.data != (void *)0x0) {
              free(local_a28.data);
            }
          }
          else {
            (**(code **)(*(long *)local_a28.allocator + 0x18))();
          }
        }
      }
      lVar9 = 0x8c0;
      do {
        piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar9);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar4 = *(void **)((long)&local_930.params[0].type + lVar9);
            plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar9);
            if (plVar5 == (long *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (**(code **)(*plVar5 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_930.params[0].v.data + lVar9 + 4) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar9 + 4) = 0;
        *(undefined8 *)((long)&local_930.params[0].type + lVar9) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.data + lVar9) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar9) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.dims + lVar9) = 0;
        *(undefined8 *)((long)&local_930.params[0].v.h + lVar9) = 0;
        lVar9 = lVar9 + -0x48;
      } while (lVar9 != -0x40);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->num_output);
  }
  return 0;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    // runtime quantize the weight data
    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int n=0; n<num_output; n++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[n]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * n, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * n, weight_data_size_output);
            op->forward(weight_data_n, int8_weight_data_n, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    // initial the quantize,dequantize op layer
    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->create_pipeline(opt);
        }

        dequantize_ops.resize(num_output);
        for (int n=0; n<num_output; n++)
        {
            dequantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;

            if (weight_data_int8_scales[n] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);  // bias_term
            pd.set(2, 1);          // bias_data_size

            dequantize_ops[n]->load_param(pd);

            dequantize_ops[n]->create_pipeline(opt);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(n, 1);

            dequantize_ops[n]->load_model(ModelBinFromMatArray(weights));

            dequantize_scales.push_back(top_rescale);
        }
    }

    return 0;
}